

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O2

int libpd_message(char *recv,char *msg,int argc,t_atom *argv)

{
  t_pd *x;
  t_symbol *s;
  int iVar1;
  
  sys_lock();
  x = (t_pd *)get_object(recv);
  if (x == (t_pd *)0x0) {
    iVar1 = -1;
  }
  else {
    s = gensym(msg);
    pd_typedmess(x,s,argc,argv);
    iVar1 = 0;
  }
  sys_unlock();
  return iVar1;
}

Assistant:

int libpd_message(const char *recv, const char *msg, int argc, t_atom *argv) {
  t_pd *obj;
  sys_lock();
  obj = get_object(recv);
  if (obj == NULL)
  {
    sys_unlock();
    return -1;
  }
  pd_typedmess(obj, gensym(msg), argc, argv);
  sys_unlock();
  return 0;
}